

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Utf8Dfa.h
# Opt level: O1

void __thiscall
axl::enc::Utf8Dfa::
emitPendingCus<axl::enc::Convert<axl::enc::Utf8,axl::enc::Utf8,axl::enc::ToUpperCase,axl::enc::Utf8Decoder>::EncodingEmitter_u>
          (Utf8Dfa *this,EncodingEmitter_u *emitter,utf8_t *p)

{
  uint_t uVar1;
  uint32_t uVar2;
  C *pCVar3;
  DstUnit *p_00;
  utf32_t replacement;
  uint uVar4;
  
  uVar1 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_state;
  switch(uVar1 << 0x1d | uVar1 - 0x10 >> 3) {
  case 0:
  case 1:
    uVar4 = 0xc0;
    break;
  case 2:
  case 3:
    uVar4 = 0xe0;
    break;
  case 4:
    uVar4 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 6 | 0xe0;
    goto LAB_0011f59e;
  default:
    goto switchD_0011f556_caseD_5;
  case 6:
  case 7:
    uVar4 = 0xf0;
    break;
  case 8:
    uVar4 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 6 | 0xf0;
LAB_0011f59e:
    pCVar3 = emitter->m_p;
    uVar2 = toUpperCase(uVar4);
    p_00 = Utf8Encoder::encode(pCVar3,uVar2,emitter->m_replacement);
    emitter->m_p = p_00;
    uVar4 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp;
LAB_0011f622:
    uVar2 = toUpperCase(uVar4 & 0x3f | 0x80);
    replacement = emitter->m_replacement;
    goto LAB_0011f62d;
  case 10:
    pCVar3 = emitter->m_p;
    uVar2 = toUpperCase((this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 0xc |
                        0xf0);
    pCVar3 = Utf8Encoder::encode(pCVar3,uVar2,emitter->m_replacement);
    emitter->m_p = pCVar3;
    uVar2 = toUpperCase((uint)(this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 6
                        & 0x3f | 0x80);
    p_00 = Utf8Encoder::encode(pCVar3,uVar2,emitter->m_replacement);
    emitter->m_p = p_00;
    uVar4 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp;
    goto LAB_0011f622;
  }
  p_00 = emitter->m_p;
  uVar2 = toUpperCase(uVar4 | (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp);
  replacement = emitter->m_replacement;
LAB_0011f62d:
  pCVar3 = Utf8Encoder::encode(p_00,uVar2,replacement);
  emitter->m_p = pCVar3;
switchD_0011f556_caseD_5:
  return;
}

Assistant:

void
	emitPendingCus(
		Emitter& emitter,
		const utf8_t* p
	) {
		switch (m_state) {
		case State_1_2:
		case State_1_2_Error:
			emitter.emitCu(p, 0xc0 | m_cp);
			break;

		case State_1_3:
		case State_1_3_Error:
			emitter.emitCu(p, 0xe0 | m_cp);
			break;

		case State_2_3:
			emitter.emitCu(p - 1, 0xe0 | (m_cp >> 6));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;

		case State_1_4:
		case State_1_4_Error:
			emitter.emitCu(p, 0xf0 | m_cp);
			break;

		case State_2_4:
			emitter.emitCu(p - 1, 0xf0 | (m_cp >> 6));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;

		case State_3_4:
			emitter.emitCu(p - 2, 0xf0 | (m_cp >> 12));
			emitter.emitCu(p - 1, 0x80 | ((m_cp >> 6) & 0x3f));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;
		}
	}